

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstring_agg.cpp
# Opt level: O2

unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true> __thiscall
duckdb::BitstringPropagateStats
          (duckdb *this,ClientContext *context,BoundAggregateExpression *expr,
          AggregateStatisticsInput *input)

{
  bool bVar1;
  reference pvVar2;
  FunctionData *pFVar3;
  Value local_60;
  
  pvVar2 = vector<duckdb::BaseStatistics,_true>::get<true>(input->child_stats,0);
  bVar1 = NumericStats::HasMinMax(pvVar2);
  if (bVar1) {
    pFVar3 = optional_ptr<duckdb::FunctionData,_true>::operator->(&input->bind_data);
    pvVar2 = vector<duckdb::BaseStatistics,_true>::get<true>(input->child_stats,0);
    NumericStats::Min(&local_60,pvVar2);
    Value::operator=((Value *)(pFVar3 + 1),&local_60);
    Value::~Value(&local_60);
    pvVar2 = vector<duckdb::BaseStatistics,_true>::get<true>(input->child_stats,0);
    NumericStats::Max(&local_60,pvVar2);
    Value::operator=((Value *)(pFVar3 + 9),&local_60);
    Value::~Value(&local_60);
  }
  *(undefined8 *)this = 0;
  return (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
         (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)this;
}

Assistant:

unique_ptr<BaseStatistics> BitstringPropagateStats(ClientContext &context, BoundAggregateExpression &expr,
                                                   AggregateStatisticsInput &input) {

	if (NumericStats::HasMinMax(input.child_stats[0])) {
		auto &bind_agg_data = input.bind_data->Cast<BitstringAggBindData>();
		bind_agg_data.min = NumericStats::Min(input.child_stats[0]);
		bind_agg_data.max = NumericStats::Max(input.child_stats[0]);
	}
	return nullptr;
}